

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O3

int testEmptyKNNValidationGood(void)

{
  ulong uVar1;
  TypeUnion this;
  bool bVar2;
  UniformWeighting *pUVar3;
  NearestNeighborsIndex *this_00;
  SquaredEuclideanDistance *pSVar4;
  SingleKdTreeIndex *pSVar5;
  ostream *poVar6;
  undefined8 *puVar7;
  int iVar8;
  Arena *pAVar9;
  Result res;
  Model m1;
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  Model local_78;
  undefined1 local_48 [8];
  _Alloc_hider local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  CoreML::Specification::Model::Model(&local_78,(Arena *)0x0,false);
  CoreML::KNNValidatorTests::generateInterface(&local_78);
  if (local_78._oneof_case_[0] != 0x194) {
    CoreML::Specification::Model::clear_Type(&local_78);
    local_78._oneof_case_[0] = 0x194;
    pAVar9 = (Arena *)(local_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar9 = *(Arena **)pAVar9;
    }
    local_78.Type_.knearestneighborsclassifier_ =
         google::protobuf::Arena::
         CreateMaybeMessage<CoreML::Specification::KNearestNeighborsClassifier>(pAVar9);
  }
  this = local_78.Type_;
  CoreML::KNNValidatorTests::setNumberOfNeighbors
            (local_78.Type_.knearestneighborsclassifier_,3,true);
  if (((this.supportvectorclassifier_)->rho_).total_size_ != 200) {
    CoreML::Specification::KNearestNeighborsClassifier::clear_WeightingScheme
              (this.knearestneighborsclassifier_);
    ((this.supportvectorclassifier_)->rho_).total_size_ = 200;
    uVar1 = ((this.pipelineclassifier_)->super_MessageLite)._internal_metadata_.ptr_;
    pAVar9 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar9 = *(Arena **)pAVar9;
    }
    pUVar3 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::UniformWeighting>
                       (pAVar9);
    ((WeightingSchemeUnion *)((DefaultClassLabelUnion *)&(this.pipeline_)->names_ + 1))->
    uniformweighting_ = pUVar3;
  }
  this_00 = (this.knearestneighborsclassifier_)->nearestneighborsindex_;
  if (this_00 == (NearestNeighborsIndex *)0x0) {
    uVar1 = ((this.pipelineclassifier_)->super_MessageLite)._internal_metadata_.ptr_;
    pAVar9 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar9 = *(Arena **)pAVar9;
    }
    this_00 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::NearestNeighborsIndex>(pAVar9);
    (this.knearestneighborsclassifier_)->nearestneighborsindex_ = this_00;
  }
  if (this_00->_oneof_case_[1] != 200) {
    CoreML::Specification::NearestNeighborsIndex::clear_DistanceFunction(this_00);
    this_00->_oneof_case_[1] = 200;
    uVar1 = (this_00->super_MessageLite)._internal_metadata_.ptr_;
    pAVar9 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar9 = *(Arena **)pAVar9;
    }
    pSVar4 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::SquaredEuclideanDistance>(pAVar9);
    (this_00->DistanceFunction_).squaredeuclideandistance_ = pSVar4;
  }
  if (this_00->_oneof_case_[0] == 0x6e) {
    pSVar5 = (this_00->IndexType_).singlekdtreeindex_;
  }
  else {
    CoreML::Specification::NearestNeighborsIndex::clear_IndexType(this_00);
    this_00->_oneof_case_[0] = 0x6e;
    uVar1 = (this_00->super_MessageLite)._internal_metadata_.ptr_;
    pAVar9 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar9 = *(Arena **)pAVar9;
    }
    pSVar5 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::SingleKdTreeIndex>
                       (pAVar9);
    (this_00->IndexType_).singlekdtreeindex_ = pSVar5;
  }
  pSVar5->leafsize_ = 0x1e;
  CoreML::validate<(MLModelType)404>((Result *)local_a0,&local_78);
  bVar2 = CoreML::Result::good((Result *)local_a0);
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
               ,0x69);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x17d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  }
  else {
    if (((this.supportvectorclassifier_)->rho_).current_size_ != 0x6e) {
      CoreML::Specification::KNearestNeighborsClassifier::clear_DefaultClassLabel
                (this.knearestneighborsclassifier_);
      ((this.supportvectorclassifier_)->rho_).current_size_ = 0x6e;
      ((DefaultClassLabelUnion *)&(this.pipeline_)->names_)->defaultint64label_ =
           (int64_t)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    uVar1 = ((this.pipelineclassifier_)->super_MessageLite)._internal_metadata_.ptr_;
    puVar7 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar7 = (undefined8 *)*puVar7;
    }
    google::protobuf::internal::ArenaStringPtr::
    Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
              ((ArenaStringPtr *)&(this.pipeline_)->names_,"Default",puVar7);
    CoreML::validate<(MLModelType)404>((Result *)local_48,&local_78);
    local_a0 = local_48;
    std::__cxx11::string::operator=((string *)&local_98,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_p != &local_30) {
      operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
    }
    bVar2 = CoreML::Result::good((Result *)local_a0);
    if (bVar2) {
      if (((this.supportvectorclassifier_)->rho_).current_size_ == 0x6e) {
        uVar1 = ((this.pipelineclassifier_)->super_MessageLite)._internal_metadata_.ptr_;
        puVar7 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
        if ((uVar1 & 1) != 0) {
          puVar7 = (undefined8 *)*puVar7;
        }
        google::protobuf::internal::ArenaStringPtr::Destroy
                  ((ArenaStringPtr *)&(this.pipeline_)->names_,puVar7);
        ((this.supportvectorclassifier_)->rho_).current_size_ = 0;
      }
      CoreML::validate<(MLModelType)404>((Result *)local_48,&local_78);
      local_a0 = local_48;
      std::__cxx11::string::operator=((string *)&local_98,(string *)&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_p != &local_30) {
        operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
      }
      bVar2 = CoreML::Result::good((Result *)local_a0);
      iVar8 = 0;
      if (!bVar2) goto LAB_001494e4;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                 ,0x69);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x189);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"!((res).good())",0xf);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                 ,0x69);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x183);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(res).good()",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    }
  }
  std::ostream::put((char)poVar6);
  iVar8 = 1;
  std::ostream::flush();
LAB_001494e4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_p != &local_88) {
    operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_78);
  return iVar8;
}

Assistant:

int testEmptyKNNValidationGood() {
    
    Specification::Model m1;
    
    KNNValidatorTests::generateInterface(m1);
    
    auto *knnClassifier = m1.mutable_knearestneighborsclassifier();
    KNNValidatorTests::setNumberOfNeighbors(knnClassifier, 3, true);
    knnClassifier->mutable_uniformweighting();
    
    auto *nnIndex = knnClassifier->mutable_nearestneighborsindex();
    nnIndex->mutable_squaredeuclideandistance();
    auto *kdTree = nnIndex->mutable_singlekdtreeindex();
    kdTree->set_leafsize(30);
    
    // Validation should fail since we are not telling the label type.
    Result res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);
    
    knnClassifier->set_defaultstringlabel("Default");
    
    // Validation should pass now.
    res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_GOOD(res);
    
    knnClassifier->clear_defaultstringlabel();
    
    // Validation should fail since we are not telling the label type.
    res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    return 0;    
}